

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Mirror.cpp
# Opt level: O1

void __thiscall chrono::ChFunction_Mirror::ArchiveIN(ChFunction_Mirror *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Mirror>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_38._value = &this->fa;
  local_38._name = "fa";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->mirror_axis;
  local_38._name = "mirror_axis";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_Mirror::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Mirror>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(fa);
    marchive >> CHNVP(mirror_axis);
}